

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_parse_url_options(connectdata *conn)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *value;
  size_t len;
  char *key;
  char *pcStack_30;
  _Bool reset;
  char *ptr;
  char *options;
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = CURLE_OK;
  pcStack_30 = conn->options;
  bVar1 = true;
  while( true ) {
    pcVar3 = pcStack_30;
    bVar4 = false;
    if (pcStack_30 != (char *)0x0) {
      bVar4 = *pcStack_30 != '\0';
    }
    if (!bVar4) break;
    while( true ) {
      bVar4 = false;
      if (*pcStack_30 != '\0') {
        bVar4 = *pcStack_30 != '=';
      }
      if (!bVar4) break;
      pcStack_30 = pcStack_30 + 1;
    }
    iVar2 = curl_strnequal(pcVar3,"AUTH",4);
    if (iVar2 == 0) {
      pop3c._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      value = (char *)0x0;
      pcVar3 = pcStack_30 + 1;
      pcStack_30 = pcVar3;
      if (bVar1) {
        bVar1 = false;
        (conn->proto).pop3c.preftype = 0;
        (conn->proto).pop3c.prefmech = 0;
      }
      while( true ) {
        bVar4 = false;
        if (*pcStack_30 != '\0') {
          bVar4 = *pcStack_30 != ';';
        }
        if (!bVar4) break;
        value = value + 1;
        pcStack_30 = pcStack_30 + 1;
      }
      iVar2 = curl_strnequal(pcVar3,"*",(size_t)value);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal(pcVar3,"+APOP",(size_t)value);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal(pcVar3,"LOGIN",(size_t)value);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal(pcVar3,"PLAIN",(size_t)value);
            if (iVar2 == 0) {
              iVar2 = curl_strnequal(pcVar3,"CRAM-MD5",(size_t)value);
              if (iVar2 == 0) {
                iVar2 = curl_strnequal(pcVar3,"DIGEST-MD5",(size_t)value);
                if (iVar2 == 0) {
                  iVar2 = curl_strnequal(pcVar3,"GSSAPI",(size_t)value);
                  if (iVar2 == 0) {
                    iVar2 = curl_strnequal(pcVar3,"NTLM",(size_t)value);
                    if (iVar2 == 0) {
                      iVar2 = curl_strnequal(pcVar3,"XOAUTH2",(size_t)value);
                      if (iVar2 != 0) {
                        (conn->proto).pop3c.preftype = 4;
                        (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 0x80;
                      }
                    }
                    else {
                      (conn->proto).pop3c.preftype = 4;
                      (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 0x40;
                    }
                  }
                  else {
                    (conn->proto).pop3c.preftype = 4;
                    (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 0x10;
                  }
                }
                else {
                  (conn->proto).pop3c.preftype = 4;
                  (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 8;
                }
              }
              else {
                (conn->proto).pop3c.preftype = 4;
                (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 4;
              }
            }
            else {
              (conn->proto).pop3c.preftype = 4;
              (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 2;
            }
          }
          else {
            (conn->proto).pop3c.preftype = 4;
            (conn->proto).pop3c.prefmech = (conn->proto).pop3c.prefmech | 1;
          }
        }
        else {
          (conn->proto).pop3c.preftype = 2;
          (conn->proto).pop3c.prefmech = 0;
        }
      }
      else {
        (conn->proto).pop3c.preftype = 0xffffffff;
        (conn->proto).pop3c.prefmech = 0xffffffff;
      }
      if (*pcStack_30 == ';') {
        pcStack_30 = pcStack_30 + 1;
      }
    }
  }
  return pop3c._4_4_;
}

Assistant:

static CURLcode pop3_parse_url_options(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *options = conn->options;
  const char *ptr = options;
  bool reset = TRUE;

  while(ptr && *ptr) {
    const char *key = ptr;

    while(*ptr && *ptr != '=')
        ptr++;

    if(strnequal(key, "AUTH", 4)) {
      size_t len = 0;
      const char *value = ++ptr;

      if(reset) {
        reset = FALSE;
        pop3c->preftype = POP3_TYPE_NONE;
        pop3c->prefmech = SASL_AUTH_NONE;
      }

      while(*ptr && *ptr != ';') {
        ptr++;
        len++;
      }

      if(strnequal(value, "*", len)) {
        pop3c->preftype = POP3_TYPE_ANY;
        pop3c->prefmech = SASL_AUTH_ANY;
      }
      else if(strnequal(value, "+APOP", len)) {
        pop3c->preftype = POP3_TYPE_APOP;
        pop3c->prefmech = SASL_AUTH_NONE;
      }
      else if(strnequal(value, SASL_MECH_STRING_LOGIN, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_LOGIN;
      }
      else if(strnequal(value, SASL_MECH_STRING_PLAIN, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_PLAIN;
      }
      else if(strnequal(value, SASL_MECH_STRING_CRAM_MD5, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_CRAM_MD5;
      }
      else if(strnequal(value, SASL_MECH_STRING_DIGEST_MD5, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_DIGEST_MD5;
      }
      else if(strnequal(value, SASL_MECH_STRING_GSSAPI, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_GSSAPI;
      }
      else if(strnequal(value, SASL_MECH_STRING_NTLM, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_NTLM;
      }
      else if(strnequal(value, SASL_MECH_STRING_XOAUTH2, len)) {
        pop3c->preftype = POP3_TYPE_SASL;
        pop3c->prefmech |= SASL_MECH_XOAUTH2;
      }

      if(*ptr == ';')
        ptr++;
    }
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}